

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

DirWatcherGeneric * __thiscall
efsw::DirWatcherGeneric::findDirWatcher(DirWatcherGeneric *this,string *dir)

{
  DirWatcherGeneric *this_00;
  __type _Var1;
  bool bVar2;
  pointer ppVar3;
  string local_58;
  _Self local_38;
  _Self local_30;
  iterator it;
  DirWatcherGeneric *watcher;
  string *dir_local;
  DirWatcherGeneric *this_local;
  
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &this->DirSnap,dir);
  this_local = this;
  if (!_Var1) {
    it._M_node = (_Base_ptr)0x0;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
         ::begin(&this->Directories);
    while( true ) {
      local_38._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
           ::end(&this->Directories);
      bVar2 = std::operator!=(&local_30,&local_38);
      if (!bVar2) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
               ::operator->(&local_30);
      this_00 = ppVar3->second;
      std::__cxx11::string::string((string *)&local_58,(string *)dir);
      it._M_node = (_Base_ptr)findDirWatcher(this_00,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (it._M_node != (_Base_ptr)0x0) {
        return (DirWatcherGeneric *)it._M_node;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>
      ::operator++(&local_30,0);
    }
    this_local = (DirWatcherGeneric *)0x0;
  }
  return this_local;
}

Assistant:

DirWatcherGeneric * DirWatcherGeneric::findDirWatcher( std::string dir )
{
	if ( DirSnap.DirectoryInfo.Filepath == dir )
	{
		return this;
	}
	else
	{
		DirWatcherGeneric * watcher = NULL;

		for ( DirWatchMap::iterator it = Directories.begin(); it != Directories.end(); it++ )
		{
			watcher = it->second->findDirWatcher( dir );

			if ( NULL != watcher )
			{
				return watcher;
			}
		}
	}

	return NULL;
}